

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

void __thiscall
Color::Color(Color *this,color_id fg,color_id bg,bool underline,bool bold,bool bright)

{
  color_id cVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  color_id cVar2;
  undefined7 in_register_00000089;
  
  cVar2 = (int)CONCAT71(in_register_00000089,bright) << 0x10 |
          (int)CONCAT71(in_register_00000081,bold) << 0x11 |
          (int)CONCAT71(in_register_00000009,underline) << 0x12;
  cVar1 = bg << 8 | cVar2 | 0x100000;
  if (bg == nocolor) {
    cVar1 = cVar2;
  }
  cVar2 = cVar1 | fg | 0x80000;
  if (fg == nocolor) {
    cVar2 = cVar1;
  }
  this->_value = cVar2;
  return;
}

Assistant:

Color::Color (color_id fg, color_id bg, bool underline, bool bold, bool bright)
: _value (0)
{
#ifdef FEATURE_COLOR
  _value |= ((underline ? 1 : 0) << 18)
         |  ((bold      ? 1 : 0) << 17)
         |  ((bright    ? 1 : 0) << 16);

  if (bg != Color::nocolor)
  {
    _value |= _COLOR_HASBG;
    _value |= (bg << 8);
  }

  if (fg != Color::nocolor)
  {
    _value |= _COLOR_HASFG;
    _value |= fg;
  }
#endif
}